

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCV.cpp
# Opt level: O2

void __thiscall TCV::visit(TCV *this,Calls *node)

{
  _Elt_pointer ppAVar1;
  deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_> *pdVar2;
  _Elt_pointer ppAVar3;
  _Map_pointer pppAVar4;
  ASTNode **child;
  _Elt_pointer ppAVar5;
  
  pdVar2 = AST::ASTNode::getChildren(&node->super_ASTNode);
  ppAVar5 = (pdVar2->super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>)._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  ppAVar3 = (pdVar2->super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>)._M_impl.
            super__Deque_impl_data._M_start._M_last;
  pppAVar4 = (pdVar2->super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>)._M_impl.
             super__Deque_impl_data._M_start._M_node;
  ppAVar1 = (pdVar2->super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>)._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  while (ppAVar5 != ppAVar1) {
    AST::ASTNode::setParent(*ppAVar5,&node->super_ASTNode);
    (**(*ppAVar5)->_vptr_ASTNode)(*ppAVar5,this);
    lastProcessedNode = lastProcessedNode + 1;
    ppAVar5 = ppAVar5 + 1;
    if (ppAVar5 == ppAVar3) {
      ppAVar5 = pppAVar4[1];
      pppAVar4 = pppAVar4 + 1;
      ppAVar3 = ppAVar5 + 0x40;
    }
  }
  lastProcessedNode = -1;
  return;
}

Assistant:

void TCV::visit(Calls *node) {
    for (const auto &child: node->getChildren()) {
        child->setParent(node);
        child->accept(*this);
        lastProcessedNode++;
    }
    lastProcessedNode = -1;
}